

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O3

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  uv_pipe_t *puVar2;
  code **ppcVar3;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_20;
  undefined8 local_18;
  void *local_10;
  
  if (req == &connect_req) {
    local_10 = (void *)(long)status;
    local_18 = 0;
    if (local_10 == (void *)0x0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      pcStack_20 = (code *)0x1b337b;
      uv_close(&pipe_client,pipe_close_cb);
      uv_close(&pipe_server,pipe_close_cb);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x1b3394;
    pipe_client_connect_cb_cold_1();
  }
  puVar2 = (uv_pipe_t *)&stack0xfffffffffffffff0;
  pcStack_20 = pipe_close_cb;
  pipe_client_connect_cb_cold_2();
  pcStack_20 = (code *)(ulong)(puVar2 == &pipe_server || puVar2 == &pipe_client);
  if (pcStack_20 != (code *)0x0) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return;
  }
  ppcVar3 = &pcStack_20;
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(ppcVar3,0);
  return;
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT_OK(r);

  if (*buf == '\0') {  /* Linux abstract socket. */
    const char expected[] = "\0" TEST_PIPENAME;
    ASSERT_EQ(len, sizeof(expected) - 1);
    ASSERT_MEM_EQ(buf, expected, len);
  } else {
    ASSERT_NE(0, buf[len - 1]);
    ASSERT_MEM_EQ(buf, TEST_PIPENAME, len);
  }

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;

  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}